

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64_unit.cpp
# Opt level: O2

void anon_unknown.dwarf_3ee9::test_maximum(void **param_1)

{
  roaring64_bitmap_t *r;
  uint64_t uVar1;
  
  r = roaring64_bitmap_create();
  uVar1 = roaring64_bitmap_maximum(r);
  _assert_int_equal(uVar1,0,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
                    ,0x36c);
  roaring64_bitmap_add(r,0);
  roaring64_bitmap_add(r,0x400000001);
  roaring64_bitmap_add(r,0x800000001);
  roaring64_bitmap_add(r,0x800000002);
  uVar1 = roaring64_bitmap_maximum(r);
  _assert_int_equal(uVar1,0x800000002,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
                    ,0x373);
  roaring64_bitmap_free(r);
  return;
}

Assistant:

DEFINE_TEST(test_maximum) {
    roaring64_bitmap_t* r = roaring64_bitmap_create();

    assert_int_equal(roaring64_bitmap_maximum(r), 0);

    roaring64_bitmap_add(r, 0);
    roaring64_bitmap_add(r, (1ULL << 34) + 1);
    roaring64_bitmap_add(r, (1ULL << 35) + 1);
    roaring64_bitmap_add(r, (1ULL << 35) + 2);

    assert_int_equal(roaring64_bitmap_maximum(r), ((1ULL << 35) + 2));

    roaring64_bitmap_free(r);
}